

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O2

int png_decompress_chunk
              (png_structrp png_ptr,png_uint_32 chunklength,png_uint_32 prefix_size,
              png_alloc_size_t *newlength,int terminate)

{
  png_bytep __src;
  int iVar1;
  int iVar2;
  ulong uVar3;
  png_bytep __dest;
  ulong uVar4;
  png_alloc_size_t size;
  png_alloc_size_t *in_stack_ffffffffffffffa8;
  png_uint_32 lzsize;
  png_alloc_size_t local_40;
  png_alloc_size_t local_38;
  
  uVar3 = png_ptr->user_chunk_malloc_max;
  if (uVar3 + 1 < 2) {
    uVar4 = (ulong)(prefix_size + 1);
    uVar3 = 0xffffffffffffffff;
  }
  else {
    uVar4 = (ulong)(prefix_size + 1);
    if (uVar3 < uVar4) {
      png_zstream_error(png_ptr,-4);
      return -4;
    }
  }
  if (uVar3 - uVar4 < *newlength) {
    *newlength = uVar3 - uVar4;
  }
  iVar1 = png_inflate_claim(png_ptr,png_ptr->chunk_name);
  if (iVar1 == 0) {
    uVar3 = (ulong)prefix_size;
    lzsize = chunklength - prefix_size;
    iVar2 = png_inflate(png_ptr,png_ptr->chunk_name,(int)png_ptr->read_buffer + prefix_size,
                        (png_const_bytep)&lzsize,(png_uint_32p)0x0,(png_bytep)newlength,
                        in_stack_ffffffffffffffa8);
    if (iVar2 == 1) {
      iVar1 = inflateReset(&png_ptr->zstream);
      if (iVar1 == 0) {
        local_38 = *newlength;
        size = uVar3 + local_38 + 1;
        __dest = (png_bytep)png_malloc_base(png_ptr,size);
        if (__dest == (png_bytep)0x0) {
          iVar2 = -4;
          png_zstream_error(png_ptr,-4);
        }
        else {
          local_40 = size;
          iVar2 = png_inflate(png_ptr,png_ptr->chunk_name,(int)png_ptr->read_buffer + prefix_size,
                              (png_const_bytep)&lzsize,(png_uint_32p)(__dest + uVar3),
                              (png_bytep)newlength,in_stack_ffffffffffffffa8);
          if (iVar2 == 1) {
            if (local_38 == *newlength) {
              __dest[uVar3 + local_38] = '\0';
              __src = png_ptr->read_buffer;
              if (prefix_size != 0) {
                memcpy(__dest,__src,uVar3);
              }
              png_ptr->read_buffer = __dest;
              png_ptr->read_buffer_size = local_40;
              iVar2 = 1;
              __dest = __src;
            }
            else {
              iVar2 = -7;
            }
          }
          png_free(png_ptr,__dest);
          if ((iVar2 == 1) && (iVar2 = 1, chunklength - prefix_size != lzsize)) {
            png_chunk_benign_error(png_ptr,"extra compressed data");
          }
        }
      }
      else {
        png_zstream_error(png_ptr,1);
        iVar2 = -7;
      }
    }
    png_ptr->zowner = 0;
  }
  else {
    iVar2 = -7;
    if (iVar1 != 1) {
      iVar2 = iVar1;
    }
  }
  return iVar2;
}

Assistant:

static int
png_decompress_chunk(png_structrp png_ptr,
    png_uint_32 chunklength, png_uint_32 prefix_size,
    png_alloc_size_t *newlength /* must be initialized to the maximum! */,
    int terminate /*add a '\0' to the end of the uncompressed data*/)
{
   /* TODO: implement different limits for different types of chunk.
    *
    * The caller supplies *newlength set to the maximum length of the
    * uncompressed data, but this routine allocates space for the prefix and
    * maybe a '\0' terminator too.  We have to assume that 'prefix_size' is
    * limited only by the maximum chunk size.
    */
   png_alloc_size_t limit = PNG_SIZE_MAX;

# ifdef PNG_SET_USER_LIMITS_SUPPORTED
   if (png_ptr->user_chunk_malloc_max > 0 &&
       png_ptr->user_chunk_malloc_max < limit)
      limit = png_ptr->user_chunk_malloc_max;
# elif PNG_USER_CHUNK_MALLOC_MAX > 0
   if (PNG_USER_CHUNK_MALLOC_MAX < limit)
      limit = PNG_USER_CHUNK_MALLOC_MAX;
# endif

   if (limit >= prefix_size + (terminate != 0))
   {
      int ret;

      limit -= prefix_size + (terminate != 0);

      if (limit < *newlength)
         *newlength = limit;

      /* Now try to claim the stream. */
      ret = png_inflate_claim(png_ptr, png_ptr->chunk_name);

      if (ret == Z_OK)
      {
         png_uint_32 lzsize = chunklength - prefix_size;

         ret = png_inflate(png_ptr, png_ptr->chunk_name, 1/*finish*/,
             /* input: */ png_ptr->read_buffer + prefix_size, &lzsize,
             /* output: */ NULL, newlength);

         if (ret == Z_STREAM_END)
         {
            /* Use 'inflateReset' here, not 'inflateReset2' because this
             * preserves the previously decided window size (otherwise it would
             * be necessary to store the previous window size.)  In practice
             * this doesn't matter anyway, because png_inflate will call inflate
             * with Z_FINISH in almost all cases, so the window will not be
             * maintained.
             */
            if (inflateReset(&png_ptr->zstream) == Z_OK)
            {
               /* Because of the limit checks above we know that the new,
                * expanded, size will fit in a size_t (let alone an
                * png_alloc_size_t).  Use png_malloc_base here to avoid an
                * extra OOM message.
                */
               png_alloc_size_t new_size = *newlength;
               png_alloc_size_t buffer_size = prefix_size + new_size +
                   (terminate != 0);
               png_bytep text = png_voidcast(png_bytep, png_malloc_base(png_ptr,
                   buffer_size));

               if (text != NULL)
               {
                  ret = png_inflate(png_ptr, png_ptr->chunk_name, 1/*finish*/,
                      png_ptr->read_buffer + prefix_size, &lzsize,
                      text + prefix_size, newlength);

                  if (ret == Z_STREAM_END)
                  {
                     if (new_size == *newlength)
                     {
                        if (terminate != 0)
                           text[prefix_size + *newlength] = 0;

                        if (prefix_size > 0)
                           memcpy(text, png_ptr->read_buffer, prefix_size);

                        {
                           png_bytep old_ptr = png_ptr->read_buffer;

                           png_ptr->read_buffer = text;
                           png_ptr->read_buffer_size = buffer_size;
                           text = old_ptr; /* freed below */
                        }
                     }

                     else
                     {
                        /* The size changed on the second read, there can be no
                         * guarantee that anything is correct at this point.
                         * The 'msg' pointer has been set to "unexpected end of
                         * LZ stream", which is fine, but return an error code
                         * that the caller won't accept.
                         */
                        ret = PNG_UNEXPECTED_ZLIB_RETURN;
                     }
                  }

                  else if (ret == Z_OK)
                     ret = PNG_UNEXPECTED_ZLIB_RETURN; /* for safety */

                  /* Free the text pointer (this is the old read_buffer on
                   * success)
                   */
                  png_free(png_ptr, text);

                  /* This really is very benign, but it's still an error because
                   * the extra space may otherwise be used as a Trojan Horse.
                   */
                  if (ret == Z_STREAM_END &&
                      chunklength - prefix_size != lzsize)
                     png_chunk_benign_error(png_ptr, "extra compressed data");
               }

               else
               {
                  /* Out of memory allocating the buffer */
                  ret = Z_MEM_ERROR;
                  png_zstream_error(png_ptr, Z_MEM_ERROR);
               }
            }

            else
            {
               /* inflateReset failed, store the error message */
               png_zstream_error(png_ptr, ret);

               if (ret == Z_STREAM_END)
                  ret = PNG_UNEXPECTED_ZLIB_RETURN;
            }
         }

         else if (ret == Z_OK)
            ret = PNG_UNEXPECTED_ZLIB_RETURN;

         /* Release the claimed stream */
         png_ptr->zowner = 0;
      }

      else /* the claim failed */ if (ret == Z_STREAM_END) /* impossible! */
         ret = PNG_UNEXPECTED_ZLIB_RETURN;

      return ret;
   }

   else
   {
      /* Application/configuration limits exceeded */
      png_zstream_error(png_ptr, Z_MEM_ERROR);
      return Z_MEM_ERROR;
   }
}